

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O2

int32_t FastPForLib::Simple9_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint32_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t remainingCount;
  uint uVar12;
  
  uVar5 = inCount + inOffset;
  uVar4 = (ulong)(uint)outOffset;
  do {
    uVar12 = uVar5 - inOffset;
    if (uVar5 < (uint)inOffset || uVar12 == 0) {
      return (int)uVar4 - outOffset;
    }
    lVar3 = 0;
    do {
      lVar8 = lVar3;
      if (lVar8 == 8) goto LAB_00128107;
      uVar2 = (&Simple9_Codec_intNumber)[lVar8];
      if (uVar12 <= (uint)(&Simple9_Codec_intNumber)[lVar8]) {
        uVar2 = uVar12;
      }
      uVar6 = (int)lVar8 << 0x1c;
      uVar11 = 0;
      uVar10 = (ulong)uVar2;
      uVar7 = inOffset;
      while( true ) {
        uVar9 = (ulong)uVar7;
        if (uVar10 == 0) goto LAB_001280fb;
        if (input[uVar9] >> ((&Simple9_Codec_bitLength)[lVar8] & 0x1f) != 0) break;
        uVar1 = uVar11 & 0x1f;
        uVar11 = uVar11 + (&Simple9_Codec_bitLength)[lVar8];
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 | input[uVar9] << uVar1;
        uVar10 = uVar10 - 1;
      }
      lVar3 = lVar8 + 1;
    } while ((int)uVar10 != 0);
LAB_001280fb:
    inOffset = uVar2 + inOffset;
    if (lVar8 == 8) {
LAB_00128107:
      uVar10 = (ulong)(uint)inOffset;
      inOffset = inOffset + 1;
      uVar6 = input[uVar10] | 0x80000000;
    }
    output[uVar4] = uVar6;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint32_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint32_t outVal = 0;

#if defined(_SIMPLE9_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint32_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (RLE_SELECTOR_VALUE << SIMPLE9_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += repeatCount;
      } else
#endif
      {
        // try all the bit packing possibilities
        uint32_t code = SIMPLE9_MINCODE;
        for (; code < SIMPLE9_MAXCODE; code++) {
          uint32_t intNum = Simple9_Codec_intNumber[code];
          uint32_t bitLen = Simple9_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint32_t maxVal = (1U << bitLen) - 1;
          uint32_t val = code << SIMPLE9_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint32_t inputVal = input[inPos + j];
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value (up to INT_MAX)
        if (code == SIMPLE9_MAXCODE) {
          outVal = (code << SIMPLE9_BITSIZE) | input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }